

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xeTestResultParser.cpp
# Opt level: O3

ParseResult __thiscall
xe::TestResultParser::parse(TestResultParser *this,deUint8 *bytes,int numBytes)

{
  ParseResult PVar1;
  runtime_error *this_00;
  Element EVar2;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  xml::Parser::feed(&this->m_xmlParser,bytes,numBytes);
  EVar2 = (this->m_xmlParser).m_element;
  if ((EVar2 & ~ELEMENT_END_OF_STRING) == ELEMENT_INCOMPLETE) {
    PVar1 = PARSERESULT_NOT_CHANGED;
  }
  else {
    do {
      if (EVar2 == ELEMENT_DATA) {
        handleData(this);
      }
      else if (EVar2 == ELEMENT_END) {
        handleElementEnd(this);
      }
      else if (EVar2 == ELEMENT_START) {
        handleElementStart(this);
      }
      xml::Parser::advance(&this->m_xmlParser);
      EVar2 = (this->m_xmlParser).m_element;
    } while ((EVar2 & ~ELEMENT_END_OF_STRING) != ELEMENT_INCOMPLETE);
    PVar1 = PARSERESULT_CHANGED;
  }
  if ((EVar2 == ELEMENT_END_OF_STRING) &&
     (PVar1 = PARSERESULT_COMPLETE, this->m_state != STATE_TEST_CASE_RESULT_ENDED)) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    local_50[0] = local_40;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_50,"Unexpected end of log data","");
    std::runtime_error::runtime_error(this_00,(string *)local_50);
    *(undefined ***)this_00 = &PTR__runtime_error_001284b0;
    __cxa_throw(this_00,&TestResultParseError::typeinfo,std::runtime_error::~runtime_error);
  }
  return PVar1;
}

Assistant:

TestResultParser::ParseResult TestResultParser::parse (const deUint8* bytes, int numBytes)
{
	DE_ASSERT(m_result && m_state != STATE_NOT_INITIALIZED);

	try
	{
		bool resultChanged = false;

		m_xmlParser.feed(bytes, numBytes);

		for (;;)
		{
			xml::Element curElement = m_xmlParser.getElement();

			if (curElement == xml::ELEMENT_INCOMPLETE	||
				curElement == xml::ELEMENT_END_OF_STRING)
				break;

			switch (curElement)
			{
				case xml::ELEMENT_START:	handleElementStart();		break;
				case xml::ELEMENT_END:		handleElementEnd();			break;
				case xml::ELEMENT_DATA:		handleData();				break;

				default:
					DE_ASSERT(false);
			}

			resultChanged = true;
			m_xmlParser.advance();
		}

		if (m_xmlParser.getElement() == xml::ELEMENT_END_OF_STRING)
		{
			if (m_state != STATE_TEST_CASE_RESULT_ENDED)
				throw TestResultParseError("Unexpected end of log data");

			return PARSERESULT_COMPLETE;
		}
		else
			return resultChanged ? PARSERESULT_CHANGED
								 : PARSERESULT_NOT_CHANGED;
	}
	catch (const TestResultParseError& e)
	{
		// Set error code to result.
		m_result->statusCode	= TESTSTATUSCODE_INTERNAL_ERROR;
		m_result->statusDetails	= e.what();

		return PARSERESULT_ERROR;
	}
	catch (const xml::ParseError& e)
	{
		// Set error code to result.
		m_result->statusCode	= TESTSTATUSCODE_INTERNAL_ERROR;
		m_result->statusDetails	= e.what();

		return PARSERESULT_ERROR;
	}
}